

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

void __thiscall
pbrt::PiecewiseLinear2D<3UL>::PiecewiseLinear2D(PiecewiseLinear2D<3UL> *this,Allocator alloc)

{
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_00;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_01;
  long in_RDI;
  int i;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffff68;
  polymorphic_allocator<float> *in_stack_ffffffffffffff70;
  polymorphic_allocator<float> *this_02;
  vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
  *this_03;
  uint local_44;
  polymorphic_allocator<float> local_40;
  vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
  local_38;
  polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_> local_18 [3]
  ;
  
  Vector2<int>::Vector2((Vector2<int> *)0x734db9);
  Vector2<float>::Vector2((Vector2<float> *)0x734dc7);
  Vector2<float>::Vector2((Vector2<float> *)0x734dd5);
  pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>::
  polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>
              *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pstd::
  vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
  ::vector((vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
            *)(in_RDI + 0x30),local_18);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x50),
             (polymorphic_allocator<float> *)&local_38.nStored);
  this_00 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x70);
  this_03 = &local_38;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (this_00,(polymorphic_allocator<float> *)this_03);
  this_01 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x90);
  this_02 = &local_40;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (this_02,(polymorphic_allocator<std::byte> *)this_01);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector(this_01,this_02);
  for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
    pstd::
    vector<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,pstd::pmr::polymorphic_allocator<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>>
    ::emplace_back<pstd::pmr::polymorphic_allocator<std::byte>&>
              (this_03,(polymorphic_allocator<std::byte> *)this_00);
  }
  return;
}

Assistant:

PiecewiseLinear2D(Allocator alloc)
        : m_param_values(alloc),
          m_data(alloc),
          m_marginal_cdf(alloc),
          m_conditional_cdf(alloc) {
        for (int i = 0; i < ArraySize; ++i)
            m_param_values.emplace_back(alloc);
    }